

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O0

Availability __thiscall
anon_unknown.dwarf_6f47f7::Satisfier::SatHash
          (Satisfier *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *hash,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *preimage,ChallengeType chtype)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  pointer pTVar4;
  int in_ECX;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000020;
  map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *m;
  const_iterator it;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  key_type *in_stack_ffffffffffffff90;
  pair<(anonymous_namespace)::ChallengeType,_unsigned_int> *in_stack_ffffffffffffff98;
  Availability local_2c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ChallengeNumber((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>::
  pair<(anonymous_namespace)::ChallengeType_&,_unsigned_int,_true>
            (in_stack_ffffffffffffff98,&in_stack_ffffffffffffff90->first,
             (uint *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  sVar3 = std::
          set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
          ::count((set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                   *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  if (sVar3 == 0) {
    local_2c = NO;
  }
  else {
    if (in_ECX == 0) {
      std::
      unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
      ::operator->((unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
                    *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
    else if (in_ECX == 2) {
      pTVar4 = std::
               unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
               ::operator->((unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
                             *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      in_stack_ffffffffffffff98 =
           (pair<(anonymous_namespace)::ChallengeType,_unsigned_int> *)&pTVar4->hash256_preimages;
    }
    else if (in_ECX == 1) {
      pTVar4 = std::
               unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
               ::operator->((unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
                             *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      in_stack_ffffffffffffff90 = (key_type *)&pTVar4->ripemd160_preimages;
      in_stack_ffffffffffffff98 = in_stack_ffffffffffffff90;
    }
    else {
      pTVar4 = std::
               unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
               ::operator->((unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
                             *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      in_stack_ffffffffffffff90 = (key_type *)&pTVar4->hash160_preimages;
      in_stack_ffffffffffffff98 = in_stack_ffffffffffffff90;
    }
    std::
    map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::find((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            *)in_stack_ffffffffffffff90,
           (key_type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::
    map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::end((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *)in_stack_ffffffffffffff90);
    bVar2 = std::operator==((_Self *)in_stack_ffffffffffffff98,(_Self *)in_stack_ffffffffffffff90);
    if (bVar2) {
      local_2c = NO;
    }
    else {
      std::
      _Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)m,in_stack_00000020);
      local_2c = YES;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_2c;
}

Assistant:

miniscript::Availability SatHash(const std::vector<unsigned char>& hash, std::vector<unsigned char>& preimage, ChallengeType chtype) const {
        if (!supported.count(Challenge(chtype, ChallengeNumber(hash)))) return miniscript::Availability::NO;
        const auto& m =
            chtype == ChallengeType::SHA256 ? g_testdata->sha256_preimages :
            chtype == ChallengeType::HASH256 ? g_testdata->hash256_preimages :
            chtype == ChallengeType::RIPEMD160 ? g_testdata->ripemd160_preimages :
            g_testdata->hash160_preimages;
        auto it = m.find(hash);
        if (it == m.end()) return miniscript::Availability::NO;
        preimage = it->second;
        return miniscript::Availability::YES;
    }